

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O2

bool __thiscall PsxRelocator::parseObject(PsxRelocator *this,ByteArray *data,PsxRelocatorFile *dest)

{
  vector<PsxSegment,_std::allocator<PsxSegment>_> *this_00;
  vector<PsxSymbol,_std::allocator<PsxSymbol>_> *this_01;
  byte bVar1;
  ulong uVar2;
  pointer pPVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  byte *pbVar7;
  int *piVar8;
  uint uVar9;
  PsxRelocator *pPVar10;
  long lVar11;
  ulong length;
  size_t pos;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  PsxRelocator *pPStack_b0;
  PsxSymbol sym;
  size_t local_38;
  
  pPStack_b0 = (PsxRelocator *)data->data_;
  uVar12 = 6;
  iVar4 = bcmp(pPStack_b0,"LNK\x02.\a",6);
  if (iVar4 != 0) {
LAB_0015c68a:
    bVar14 = false;
switchD_0015c6f0_caseD_2:
    return bVar14;
  }
  this_00 = &dest->segments;
  this_01 = &dest->symbols;
  local_38 = 0xffffffff;
LAB_0015c6c7:
  lVar11 = 0xffffffff;
LAB_0015c6ca:
  uVar2 = data->size_;
  bVar14 = uVar2 <= uVar12;
  if (bVar14) {
    return bVar14;
  }
  pbVar7 = data->data_;
  uVar9 = (uint)(pbVar7[uVar12] >> 1) | (uint)((pbVar7[uVar12] & 1) != 0) << 0x1f;
  if (0x26 < uVar9) {
    return bVar14;
  }
  iVar4 = (int)lVar11;
  switch(uVar9) {
  case 0:
    uVar12 = uVar12 + 1;
    goto LAB_0015c6ca;
  case 1:
    length = 0xffffffffffffffff;
    if (uVar12 + 2 < uVar2) {
      length = (ulong)*(ushort *)(pbVar7 + uVar12 + 1);
    }
    ByteArray::mid((ByteArray *)&sym,data,uVar12 + 3,length);
    pPVar3 = (this_00->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = pPVar3[iVar4].data.size_;
    ByteArray::append(&pPVar3[iVar4].data,(ByteArray *)&sym);
    uVar12 = uVar12 + 3 + length;
    goto LAB_0015c9b3;
  default:
    goto switchD_0015c6f0_caseD_2;
  case 3:
    uVar9 = 0xffffffff;
    if (uVar12 + 2 < uVar2) {
      uVar9 = (uint)*(ushort *)(pbVar7 + uVar12 + 1);
    }
    uVar12 = uVar12 + 3;
    pPVar3 = (dest->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPStack_b0 = (PsxRelocator *)0x58;
    piVar8 = &pPVar3->id;
    lVar11 = 0;
    while( true ) {
      if (((long)(dest->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x58 == lVar11)
      goto LAB_0015c6c7;
      if (*piVar8 == uVar9) break;
      lVar11 = lVar11 + 1;
      piVar8 = piVar8 + 0x16;
    }
    goto LAB_0015c6ca;
  case 4:
    sVar6 = 0xffffffffffffffff;
    if (uVar12 + 2 < uVar2) {
      sVar6 = (size_t)*(ushort *)(pbVar7 + uVar12 + 1);
    }
    ByteArray::ByteArray((ByteArray *)&sym);
    ByteArray::reserveBytes((ByteArray *)&sym,sVar6,'\0');
    ByteArray::append(&(this_00->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>).
                       _M_impl.super__Vector_impl_data._M_start[iVar4].data,(ByteArray *)&sym);
    uVar12 = uVar12 + 3;
LAB_0015c9b3:
    pPStack_b0 = (PsxRelocator *)&sym;
    ByteArray::~ByteArray((ByteArray *)&sym);
    goto LAB_0015c6ca;
  case 5:
    bVar1 = pbVar7[uVar12 + 1];
    sym.name.field_2._M_allocated_capacity._0_4_ = (int)(uVar12 + 2) + -2;
    sym.name._M_string_length = 0;
    if (bVar1 == '\x10') {
      sym.type = Internal;
    }
    else if (bVar1 == 'J') {
      sym.type = BSS;
    }
    else if (bVar1 == 'R') {
      sym.type = InternalID;
    }
    else {
      if (bVar1 != 'T') goto LAB_0015c68a;
      sym.type = External;
    }
    uVar9 = 0xffffffff;
    if (uVar12 + 3 < uVar2) {
      uVar9 = (uint)CONCAT11(pbVar7[uVar12 + 3],pbVar7[uVar12 + 2]);
    }
    lVar13 = uVar12 + 4;
    sym.name._M_dataplus._M_p._4_4_ = 0;
    sym.name._M_dataplus._M_p._0_4_ = uVar9 + (int)local_38;
    do {
      bVar1 = pbVar7[lVar13];
      if (bVar1 == ',') {
        sym._4_4_ = 1;
        if (pbVar7[lVar13 + 1] != '\0') goto LAB_0015cc72;
        iVar5 = ByteArray::getDoubleWord(data,lVar13 + 2,Little);
      }
      else {
        if (bVar1 != '.') {
          if (bVar1 != '\x02') goto LAB_0015c68a;
          sym._4_4_ = 0;
          sym.name._M_dataplus._M_p._4_4_ = 0xffffffff;
          if (lVar13 + 2U < data->size_) {
            sym.name._M_dataplus._M_p._4_4_ = (uint)*(ushort *)(pbVar7 + lVar13 + 1);
          }
          pPStack_b0 = (PsxRelocator *)0x3;
          goto LAB_0015ccb3;
        }
        sym._4_4_ = 1;
        if (pbVar7[lVar13 + 1] != '\0') goto LAB_0015c68a;
        iVar5 = ByteArray::getDoubleWord(data,lVar13 + 2,Little);
        iVar5 = -iVar5;
      }
      sym.name._M_string_length = CONCAT44(iVar5,(undefined4)sym.name._M_string_length);
      lVar13 = lVar13 + 6;
      pbVar7 = data->data_;
    } while( true );
  case 6:
    sym.name._M_dataplus._M_p = (pointer)&sym.name.field_2;
    sym.name._M_string_length = 0;
    sym.name.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)sym.name.field_2._M_allocated_capacity._1_3_ << 8;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sym.type = InternalID;
    sym.id = 0xffffffff;
    if (uVar12 + 2 < uVar2) {
      sym.id = (int)*(ushort *)(pbVar7 + uVar12 + 1);
    }
    sym.segment = 0xffffffff;
    if (uVar12 + 4 < uVar2) {
      sym.segment = (int)*(ushort *)(pbVar7 + uVar12 + 3);
    }
    pPVar10 = (PsxRelocator *)data;
    sym.offset = ByteArray::getDoubleWord(data,uVar12 + 5,Little);
    pos = uVar12 + 9;
    sVar6 = loadString(pPVar10,data,pos,&sym.name);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back(this_01,&sym);
    break;
  case 7:
    sym.name._M_dataplus._M_p = (pointer)&sym.name.field_2;
    sym.name._M_string_length = 0;
    sym.name.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)sym.name.field_2._M_allocated_capacity._1_3_ << 8;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sym.type = External;
    sym.id = 0xffffffff;
    if (uVar12 + 2 < uVar2) {
      sym.id = (int)*(ushort *)(pbVar7 + uVar12 + 1);
    }
    pos = uVar12 + 3;
    sVar6 = loadString(pPStack_b0,data,pos,&sym.name);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back(this_01,&sym);
    break;
  case 8:
    PsxSegment::PsxSegment((PsxSegment *)&sym);
    sym.name.field_2._8_4_ = ByteArray::getDoubleWord(data,uVar12 + 1,Little);
    pPVar10 = (PsxRelocator *)this_00;
    std::vector<PsxSegment,_std::allocator<PsxSegment>_>::push_back(this_00,(value_type *)&sym);
    bVar1 = data->data_[uVar12 + 5];
    if (bVar1 == '\b') {
      sVar6 = loadString(pPVar10,data,uVar12 + 6,
                         &(dest->segments).
                          super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].name);
      uVar12 = uVar12 + 6 + sVar6;
    }
    else {
      uVar12 = uVar12 + 5;
    }
    pPStack_b0 = (PsxRelocator *)&sym;
    PsxSegment::~PsxSegment((PsxSegment *)&sym);
    if (bVar1 != '\b') {
      return bVar14;
    }
    goto LAB_0015c6ca;
  case 9:
    sym.name._M_dataplus._M_p = (pointer)&sym.name.field_2;
    sym.name._M_string_length = 0;
    sym.name.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)sym.name.field_2._M_allocated_capacity._1_3_ << 8;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sym.type = Internal;
    sym.segment = 0xffffffff;
    if (uVar12 + 2 < uVar2) {
      sym.segment = (int)*(ushort *)(pbVar7 + uVar12 + 1);
    }
    pPVar10 = (PsxRelocator *)data;
    sym.offset = ByteArray::getDoubleWord(data,uVar12 + 3,Little);
    pos = uVar12 + 7;
    sVar6 = loadString(pPVar10,data,pos,&sym.name);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back(this_01,&sym);
    break;
  case 10:
    uVar12 = uVar12 + pbVar7[uVar12 + 4] + 5;
    goto LAB_0015c6ca;
  case 0xe:
    uVar12 = uVar12 + pbVar7[uVar12 + 3] + 4;
    goto LAB_0015c6ca;
  case 0x18:
    sym.name._M_dataplus._M_p = (pointer)&sym.name.field_2;
    sym.name._M_string_length = 0;
    sym.name.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)sym.name.field_2._M_allocated_capacity._1_3_ << 8;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sym.type = BSS;
    sym.id = 0xffffffff;
    if (uVar12 + 2 < uVar2) {
      sym.id = (int)*(ushort *)(pbVar7 + uVar12 + 1);
    }
    sym.segment = 0xffffffff;
    if (uVar12 + 4 < uVar2) {
      sym.segment = (int)*(ushort *)(pbVar7 + uVar12 + 3);
    }
    pPVar10 = (PsxRelocator *)data;
    sym.size = ByteArray::getDoubleWord(data,uVar12 + 5,Little);
    pos = uVar12 + 9;
    sVar6 = loadString(pPVar10,data,pos,&sym.name);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back(this_01,&sym);
    break;
  case 0x19:
  case 0x1e:
    uVar12 = uVar12 + 3;
    goto LAB_0015c6ca;
  case 0x1d:
    uVar12 = uVar12 + 9;
    goto LAB_0015c6ca;
  case 0x25:
    sym.name._M_dataplus._M_p = (pointer)&sym.name.field_2;
    sym.name._M_string_length = 0;
    sym.name.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)sym.name.field_2._M_allocated_capacity._1_3_ << 8;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    sym.label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sym.type = Function;
    sym.segment = 0xffffffff;
    if (uVar12 + 2 < uVar2) {
      sym.segment = (int)*(ushort *)(pbVar7 + uVar12 + 1);
    }
    pPVar10 = (PsxRelocator *)data;
    sym.offset = ByteArray::getDoubleWord(data,uVar12 + 3,Little);
    pos = uVar12 + 0x1d;
    sVar6 = loadString(pPVar10,data,pos,&sym.name);
    std::vector<PsxSymbol,_std::allocator<PsxSymbol>_>::push_back(this_01,&sym);
    break;
  case 0x26:
    goto switchD_0015c6f0_caseD_26;
  }
  uVar12 = pos + sVar6;
  pPStack_b0 = (PsxRelocator *)&sym;
  PsxSymbol::~PsxSymbol(&sym);
  goto LAB_0015c6ca;
switchD_0015c6f0_caseD_26:
  uVar12 = uVar12 + 0xb;
  goto LAB_0015c6ca;
LAB_0015cc72:
  if (pbVar7[lVar13 + 1] != '\x04') goto LAB_0015c68a;
  sym.name._M_dataplus._M_p._4_4_ = 0xffffffff;
  if (lVar13 + 3U < data->size_) {
    sym.name._M_dataplus._M_p._4_4_ = (uint)*(ushort *)(pbVar7 + lVar13 + 2);
  }
  if (pbVar7[lVar13 + 4] != '\0') goto LAB_0015c68a;
  iVar5 = ByteArray::getDoubleWord(data,lVar13 + 5,Little);
  sym.name._M_string_length = CONCAT44(sym.name._M_string_length._4_4_,iVar5);
  pPStack_b0 = (PsxRelocator *)0x9;
LAB_0015ccb3:
  uVar12 = lVar13 + (long)pPStack_b0;
  pPStack_b0 = (PsxRelocator *)
               &(this_00->super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar4].relocations;
  std::vector<PsxRelocation,_std::allocator<PsxRelocation>_>::push_back
            ((vector<PsxRelocation,_std::allocator<PsxRelocation>_> *)pPStack_b0,(value_type *)&sym)
  ;
  goto LAB_0015c6ca;
}

Assistant:

bool PsxRelocator::parseObject(ByteArray data, PsxRelocatorFile& dest)
{
	if (memcmp(data.data(),psxObjectFileMagicNum,sizeof(psxObjectFileMagicNum)) != 0)
		return false;

	size_t pos = 6;

	std::vector<PsxSegment>& segments = dest.segments;
	std::vector<PsxSymbol>& syms = dest.symbols;

	int activeSegment = -1;
	int lastSegmentPartStart = -1;
	while (pos < data.size())
	{
		switch (data[pos])
		{
		case 0x10:	// segment definition
			{
				PsxSegment seg;
				seg.id = data.getDoubleWord(pos+1);
				segments.push_back(seg);
				pos += 5;

				if (data[pos] != 8)
					return false;

				std::string& name = segments[segments.size()-1].name;
				pos += 1 + loadString(data,pos+1,name);
			}
			break;
		case 0x14:	// group?
			pos += data[pos+4]+5;
			break;
		case 0x1C:	// source file name
			pos += data[pos+3]+4;
			break;

		case 0x06:	// set segment id
			{
				int id = data.getWord(pos+1);
				pos += 3;
				
				int num = -1;
				for (size_t i = 0; i < segments.size(); i++)
					{
					if (segments[i].id == id)
					{
						num = (int) i;
						break;
					}
				}

				activeSegment = num;
			}
			break;
		case 0x02:	// append to data segment
			{
				int size = data.getWord(pos+1);
				pos += 3;

				ByteArray d = data.mid(pos,size);
				pos += size;

				lastSegmentPartStart = (int) segments[activeSegment].data.size();
				segments[activeSegment].data.append(d);
			}
			break;
		case 0x08:	// append zeroes data segment
			{
				int size = data.getWord(pos+1);
				pos += 3;

				ByteArray d;
				d.reserveBytes(size);
				segments[activeSegment].data.append(d);
			}
			break;
		case 0x0A:	// relocation data
			{
				int type = data[pos+1];
				pos += 2;

				PsxRelocation rel;
				rel.relativeOffset = 0;
				rel.filePos = (int) pos-2;

				switch (type)
				{
				case 0x10:	// 32 bit word
					rel.type = PsxRelocationType::WordLiteral;
					rel.segmentOffset = data.getWord(pos);
					pos += 2;
					break;
				case 0x4A:	// jal
					rel.type = PsxRelocationType::FunctionCall;
					rel.segmentOffset = data.getWord(pos);
					pos += 2;
					break;
				case 0x52:	// upper immerdiate
					rel.type = PsxRelocationType::UpperImmediate;
					rel.segmentOffset = data.getWord(pos);
					pos += 2;
					break;
				case 0x54:	// lower immediate (add)
					rel.type = PsxRelocationType::LowerImmediate;
					rel.segmentOffset = data.getWord(pos);
					pos += 2;
					break;
				default:
					return false;
				}

				rel.segmentOffset += lastSegmentPartStart;
checkothertype:
				int otherType = data[pos++];
				switch (otherType)
				{
				case 0x02:	// reference to symbol with id num
					rel.refType = PsxRelocationRefType::SymblId;
					rel.referenceId = data.getWord(pos);
					pos += 2;
					break;
				case 0x2C:	// ref to other segment?
					rel.refType = PsxRelocationRefType::SegmentOffset;

					switch (data[pos++])
					{
					case 0x00:
						rel.relativeOffset = data.getDoubleWord(pos);
						pos += 4;
						goto checkothertype;
					case 0x04:					
						rel.referenceId = data.getWord(pos);	// segment id
						pos += 2;
					
						if (data[pos++] != 0x00)
						{
							return false;
						}

						rel.referencePos = data.getDoubleWord(pos);
						pos += 4;
						break;
					default:
						return false;
					}
					break;
				case 0x2E:	// negative ref?
					rel.refType = PsxRelocationRefType::SegmentOffset;

					switch (data[pos++])
					{
					case 0x00:
						rel.relativeOffset = -data.getDoubleWord(pos);
						pos += 4;
						goto checkothertype;
					default:
						return false;
					}
					break;
				default:
					return false;
				}

				segments[activeSegment].relocations.push_back(rel);
			}
			break;
		case 0x12:	// internal symbol
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::Internal;
				sym.segment = data.getWord(pos+1);
				sym.offset = data.getDoubleWord(pos+3);
				pos += 7 + loadString(data,pos+7,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x0E:	// external symbol
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::External;
				sym.id = data.getWord(pos+1);
				pos += 3 + loadString(data,pos+3,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x30:	// bss symbol?
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::BSS;
				sym.id = data.getWord(pos+1);
				sym.segment = data.getWord(pos+3);
				sym.size = data.getDoubleWord(pos+5);
				pos += 9 + loadString(data,pos+9,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x0C:	// internal with id
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::InternalID;
				sym.id = data.getWord(pos+1);
				sym.segment = data.getWord(pos+3);
				sym.offset = data.getDoubleWord(pos+5);
				pos += 9 + loadString(data,pos+9,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x4A:	// function
			{
				PsxSymbol sym;
				sym.type = PsxSymbolType::Function;
				sym.segment = data.getWord(pos+1);
				sym.offset = data.getDoubleWord(pos+3);
				pos += 0x1D + loadString(data,pos+0x1D,sym.name);
				syms.push_back(sym);
			}
			break;
		case 0x4C:	// function size
			pos += 11;
			break;
		case 0x3C:	// ??
			pos += 3;
			break;
		case 0x00:	// ??
			pos++;
			break;
		case 0x32:	// ??
			pos += 3;
			break;
		case 0x3A:	// ??
			pos += 9;
			break;
		default:
			return false;
		}
	}

	return true;
}